

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

CheckedError __thiscall flatbuffers::Parser::CheckPrivateLeak(Parser *this)

{
  Definition *pDVar1;
  Definition *in_RSI;
  undefined8 *puVar2;
  long *plVar3;
  bool bVar4;
  bool bVar5;
  
  if (*(char *)((long)&in_RSI[8].name._M_dataplus._M_p + 7) == '\x01') {
    for (puVar2 = (undefined8 *)in_RSI[1].name.field_2._M_allocated_capacity;
        bVar4 = puVar2 == *(undefined8 **)((long)&in_RSI[1].name.field_2 + 8), !bVar4;
        puVar2 = puVar2 + 1) {
      pDVar1 = (Definition *)*puVar2;
      for (plVar3 = (long *)pDVar1[1].file.field_2._M_allocated_capacity;
          bVar5 = plVar3 != *(long **)((long)&pDVar1[1].file.field_2 + 8), bVar5;
          plVar3 = plVar3 + 1) {
        if ((*(long *)(*plVar3 + 0xd8) != 0) || (*(long *)(*plVar3 + 0xd0) != 0)) {
          CheckPrivatelyLeakedFields(this,in_RSI,pDVar1);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') {
            if (bVar5) {
              if (bVar4) goto LAB_0011ec2b;
              goto LAB_0011eca6;
            }
            break;
          }
        }
      }
    }
LAB_0011ec2b:
    for (puVar2 = *(undefined8 **)&in_RSI[1].attributes.dict._M_t._M_impl;
        bVar4 = puVar2 == *(undefined8 **)
                           &in_RSI[1].attributes.dict._M_t._M_impl.super__Rb_tree_header._M_header,
        !bVar4; puVar2 = puVar2 + 1) {
      pDVar1 = (Definition *)*puVar2;
      if (*(char *)&pDVar1[1].name._M_dataplus._M_p == '\x01') {
        for (plVar3 = *(long **)&pDVar1[1].attributes.dict._M_t._M_impl;
            bVar5 = plVar3 != *(long **)&pDVar1[1].attributes.dict._M_t._M_impl.
                                         super__Rb_tree_header._M_header, bVar5; plVar3 = plVar3 + 1
            ) {
          if (*(long *)(*plVar3 + 0x40) != 0) {
            CheckPrivatelyLeakedFields(this,in_RSI,pDVar1);
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') {
              if (bVar5) {
                if (bVar4) goto LAB_0011eca1;
                goto LAB_0011eca6;
              }
              break;
            }
          }
        }
      }
    }
  }
LAB_0011eca1:
  *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
LAB_0011eca6:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::CheckPrivateLeak() {
  if (!opts.no_leak_private_annotations) return NoError();
  // Iterate over all structs/tables to validate we arent leaking
  // any private (structs/tables/enums)
  for (auto it = structs_.vec.begin(); it != structs_.vec.end(); it++) {
    auto &struct_def = **it;
    for (auto fld_it = struct_def.fields.vec.begin();
         fld_it != struct_def.fields.vec.end(); ++fld_it) {
      auto &field = **fld_it;

      if (field.value.type.enum_def) {
        auto err =
            CheckPrivatelyLeakedFields(struct_def, *field.value.type.enum_def);
        if (err.Check()) { return err; }
      } else if (field.value.type.struct_def) {
        auto err = CheckPrivatelyLeakedFields(struct_def,
                                              *field.value.type.struct_def);
        if (err.Check()) { return err; }
      }
    }
  }
  // Iterate over all enums to validate we arent leaking
  // any private (structs/tables)
  for (auto it = enums_.vec.begin(); it != enums_.vec.end(); ++it) {
    auto &enum_def = **it;
    if (enum_def.is_union) {
      for (auto val_it = enum_def.Vals().begin();
           val_it != enum_def.Vals().end(); ++val_it) {
        auto &val = **val_it;
        if (val.union_type.struct_def) {
          auto err =
              CheckPrivatelyLeakedFields(enum_def, *val.union_type.struct_def);
          if (err.Check()) { return err; }
        }
      }
    }
  }
  return NoError();
}